

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

Entity * __thiscall
Entity::checkCollisions(Entity *this,list<Entity_*,_std::allocator<Entity_*>_> *e)

{
  Entity *pEVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)e;
  do {
    p_Var3 = (((_List_base<Entity_*,_std::allocator<Entity_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)e) {
      return (Entity *)0x0;
    }
    pEVar1 = (Entity *)p_Var3[1]._M_next;
  } while (((pEVar1 == this) || (pEVar1->isDestructable != true)) ||
          (bVar2 = checkCircleCollision
                             (pEVar1->x,pEVar1->y,pEVar1->radius,this->x,this->y,this->radius),
          !bVar2));
  return pEVar1;
}

Assistant:

Entity *Entity::checkCollisions(std::list<Entity *>& e)
{
   std::list<Entity *>::iterator it;

   for (it = e.begin(); it != e.end(); it++) {
      Entity *entity = *it;
      if (entity == this || !entity->getDestructable())
         continue;
      float ex = entity->getX();
      float ey = entity->getY();
      float er = entity->getRadius();
      if (checkCircleCollision(ex, ey, er, x, y, radius))
         return entity;
   }

   return 0;
}